

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool ON_SubDEdgeChain::ContinueChainDefaultCallback
               (ON__UINT_PTR continue_condition,ON_SubDEdgePtr left_eptr,ON_SubDEdgePtr right_eptr)

{
  float fVar1;
  ON_SubDVertexTag OVar2;
  ON_SubDVertex *pOVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ON_SubDEdge *this;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ON_SubDEdge *this_00;
  ON_SubDEdgeSharpness OVar11;
  float local_40 [2];
  float local_38 [2];
  
  this = (ON_SubDEdge *)(left_eptr.m_ptr & 0xfffffffffffffff8);
  if (this != (ON_SubDEdge *)0x0) {
    uVar6 = (ulong)((uint)left_eptr.m_ptr & 1);
    if (this->m_vertex[uVar6] == (ON_SubDVertex *)0x0) {
      return false;
    }
    uVar10 = uVar6 ^ 1;
    pOVar3 = this->m_vertex[uVar10];
    if (pOVar3 == (ON_SubDVertex *)0x0) {
      return false;
    }
    if (this->m_vertex[uVar6] == pOVar3) {
      return false;
    }
    this_00 = (ON_SubDEdge *)(right_eptr.m_ptr & 0xfffffffffffffff8);
    if (this != this_00 && this_00 != (ON_SubDEdge *)0x0) {
      uVar9 = (uint)right_eptr.m_ptr & 1;
      if (pOVar3 != this_00->m_vertex[uVar9]) {
        return false;
      }
      if (this_00->m_vertex[uVar9 ^ 1] == (ON_SubDVertex *)0x0) {
        return false;
      }
      if (this_00->m_vertex[uVar9] == this_00->m_vertex[uVar9 ^ 1]) {
        return false;
      }
      if (continue_condition == 0) {
        return true;
      }
      if (((continue_condition & 1) == 0) || (this->m_face_count == this_00->m_face_count)) {
        if ((continue_condition & 4) != 0) {
          bVar4 = ON_SubDEdge::IsSharp(this);
          bVar5 = ON_SubDEdge::IsSharp(this_00);
          if (bVar4 != bVar5) {
            return false;
          }
        }
        if ((continue_condition & 8) != 0) {
          OVar11 = ON_SubDEdge::Sharpness(this,true);
          local_38[0] = OVar11.m_edge_sharpness[0];
          local_38[1] = OVar11.m_edge_sharpness[1];
          fVar1 = local_38[uVar10];
          OVar11 = ON_SubDEdge::Sharpness(this_00,true);
          local_40[0] = OVar11.m_edge_sharpness[0];
          local_40[1] = OVar11.m_edge_sharpness[1];
          if (fVar1 != local_40[uVar9]) {
            return false;
          }
          if (NAN(fVar1) || NAN(local_40[uVar9])) {
            return false;
          }
        }
        if (((((continue_condition & 0xf0) != 0) &&
             ((OVar2 = pOVar3->m_vertex_tag, (continue_condition & 0x10) == 0 || (OVar2 != Smooth)))
             ) && (((continue_condition & 0x20) == 0 || (OVar2 != Crease)))) &&
           (((continue_condition & 0x40) == 0 || (OVar2 != Dart)))) {
          if (-1 < (char)continue_condition) {
            return false;
          }
          if (OVar2 != Corner) {
            return false;
          }
        }
        if (((uint)continue_condition >> 8 & 1) == 0) {
          return true;
        }
        if (pOVar3->m_edge_count != 4) {
          return true;
        }
        if (pOVar3->m_face_count != 4) {
          return true;
        }
        uVar10 = this->m_face2[0].m_ptr & 0xfffffffffffffff8;
        uVar6 = this->m_face2[1].m_ptr & 0xfffffffffffffff8;
        if (uVar6 != 0 && uVar10 != 0) {
          uVar8 = this_00->m_face2[0].m_ptr & 0xfffffffffffffff8;
          uVar7 = this_00->m_face2[1].m_ptr & 0xfffffffffffffff8;
          if (uVar7 != 0 && uVar8 != 0) {
            return (uVar6 != uVar7 && uVar6 != uVar8) && (uVar10 != uVar7 && uVar10 != uVar8);
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdgeChain::ContinueChainDefaultCallback(
  ON__UINT_PTR continue_condition,
  ON_SubDEdgePtr left_eptr,
  ON_SubDEdgePtr right_eptr
)
{
  // Perform edge chain topology check
  const ON_SubDEdge* e0 = ON_SUBD_EDGE_POINTER(left_eptr.m_ptr);
  if (nullptr == e0)
    return false;
  const unsigned e0dir = (unsigned)(left_eptr.m_ptr & 1U);
  const ON_SubDVertex* v0[2] = { e0->m_vertex[e0dir], e0->m_vertex[1-e0dir] } ;
  if (nullptr == v0[0] || nullptr == v0[1])
    return false;
  if (v0[0] == v0[1])
    return false;
  const ON_SubDEdge* e1 = ON_SUBD_EDGE_POINTER(right_eptr.m_ptr);
  if (nullptr == e1)
    return false;
  // edges must be distinct
  if (e0 == e1)
    return false;
  // edges must have a common middle vertex
  const unsigned e1dir = (unsigned)(right_eptr.m_ptr & 1);
  const ON_SubDVertex* v1[2] = { e1->m_vertex[e1dir], e1->m_vertex[1 - e1dir] };
  if (v0[1] != v1[0])
    return false;
  if (nullptr == v1[1])
    return false;
  if (v1[0] == v1[1])
    return false;

  // edge chain topology check passed.
  if (0 == continue_condition)
    return true;

  if (0 != (continue_condition & 1))
  {
    // same face count check
    if (e0->m_face_count != e1->m_face_count)
      return false;
  }

  if (0 != (continue_condition & 4))
  {
    // same smooth / crease property
    if (e0->IsSharp() != e1->IsSharp())
      return false;
  }

  if (0 != (continue_condition & 8))
  {
    // equal sharpness at the common vertex check
    if ( false == (e0->Sharpness(true).EndSharpness(1-e0dir) == e1->Sharpness(true).EndSharpness(e1dir)))
      return false;
  }

  while (0 != (continue_condition & (16+32+64+128)))
  {
    // vertex tag filter
    const ON_SubDVertexTag vtag = v0[1]->m_vertex_tag;
    bool bPass = (0 != (continue_condition & 16) && ON_SubDVertexTag::Smooth == vtag);
    if (false == bPass)
      bPass = (0 != (continue_condition & 32) && ON_SubDVertexTag::Crease == vtag);
    if (false == bPass)
      bPass = (0 != (continue_condition & 64) && ON_SubDVertexTag::Dart == vtag);
    if (false == bPass)
      bPass = (0 != (continue_condition & 128) && ON_SubDVertexTag::Corner == vtag);

    if (false == bPass)
      return false;

    break;
  }

  if (0 != (continue_condition & 256) && 4 == v0[1]->m_edge_count && 4 == v0[1]->m_face_count)
  {
    // opposite interior crease check
    const ON_SubDFace* f0[2] = { ON_SUBD_FACE_POINTER(e0->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(e0->m_face2[1].m_ptr) };
    if (nullptr == f0[0] || nullptr == f0[1])
      return false;
    const ON_SubDFace* f1[2] = { ON_SUBD_FACE_POINTER(e1->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(e1->m_face2[1].m_ptr) };
    if (nullptr == f1[0] || nullptr == f1[1])
      return false;
    if (f0[0] == f1[0] || f0[0] == f1[1] || f0[1] == f1[0] || f0[1] == f1[1])
      return false; // the edges share a face
  }

  // All checks passed
  return true;
}